

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Counter.cxx
# Opt level: O0

void __thiscall Fl_Counter::draw(Fl_Counter *this)

{
  uchar uVar1;
  byte bVar2;
  Fl_Boxtype FVar3;
  int iVar4;
  int iVar5;
  Fl_Font face;
  Fl_Fontsize fsize;
  Fl_Color FVar6;
  Fl_Counter *pFVar7;
  Fl_Color local_124;
  char local_f8 [8];
  char str [128];
  int W_1;
  int W;
  int ww [5];
  int local_48;
  int local_44;
  int xx [5];
  Fl_Color local_2c;
  Fl_Boxtype local_28;
  Fl_Color selcolor;
  Fl_Boxtype boxtype [5];
  int i;
  Fl_Counter *this_local;
  
  unique0x10000643 = this;
  local_28 = Fl_Widget::box((Fl_Widget *)this);
  if (local_28 == FL_UP_BOX) {
    local_28 = FL_DOWN_BOX;
  }
  if (local_28 == FL_THIN_UP_BOX) {
    local_28 = FL_THIN_DOWN_BOX;
  }
  for (boxtype[3] = FL_FLAT_BOX; (int)boxtype[3] < 5; boxtype[3] = boxtype[3] + FL_FLAT_BOX) {
    if (this->mouseobj == boxtype[3]) {
      FVar3 = Fl_Widget::box((Fl_Widget *)this);
      FVar3 = fl_down(FVar3);
      (&local_28)[(int)boxtype[3]] = FVar3;
    }
    else {
      FVar3 = Fl_Widget::box((Fl_Widget *)this);
      (&local_28)[(int)boxtype[3]] = FVar3;
    }
  }
  uVar1 = Fl_Widget::type((Fl_Widget *)this);
  if (uVar1 == '\0') {
    iVar4 = Fl_Widget::w((Fl_Widget *)this);
    ww[1] = (iVar4 * 0xf) / 100;
    local_44 = Fl_Widget::x((Fl_Widget *)this);
    iVar4 = Fl_Widget::x((Fl_Widget *)this);
    xx[0] = iVar4 + ww[1];
    local_48 = Fl_Widget::x((Fl_Widget *)this);
    local_48 = local_48 + ww[1] * 2;
    iVar4 = Fl_Widget::w((Fl_Widget *)this);
    W_1 = iVar4 + ww[1] * -4;
    iVar4 = Fl_Widget::x((Fl_Widget *)this);
    iVar5 = Fl_Widget::w((Fl_Widget *)this);
    xx[1] = iVar4 + iVar5 + ww[1] * -2;
    iVar4 = Fl_Widget::x((Fl_Widget *)this);
    iVar5 = Fl_Widget::w((Fl_Widget *)this);
    xx[2] = (iVar4 + iVar5) - ww[1];
    ww[2] = ww[1];
  }
  else {
    iVar4 = Fl_Widget::w((Fl_Widget *)this);
    ww[1] = (iVar4 * 0x14) / 100;
    local_44 = 0;
    xx[0] = Fl_Widget::x((Fl_Widget *)this);
    local_48 = Fl_Widget::x((Fl_Widget *)this);
    local_48 = local_48 + ww[1];
    iVar4 = Fl_Widget::w((Fl_Widget *)this);
    W_1 = iVar4 + ww[1] * -2;
    iVar4 = Fl_Widget::x((Fl_Widget *)this);
    iVar5 = Fl_Widget::w((Fl_Widget *)this);
    xx[1] = (iVar4 + iVar5) - ww[1];
    xx[2] = 0;
    ww[2] = 0;
  }
  FVar3 = local_28;
  iVar4 = Fl_Widget::y((Fl_Widget *)this);
  iVar5 = Fl_Widget::h((Fl_Widget *)this);
  Fl_Widget::draw_box((Fl_Widget *)this,FVar3,local_48,iVar4,W_1,iVar5,7);
  face = textfont(this);
  fsize = textsize(this);
  fl_font(face,fsize);
  iVar4 = Fl_Widget::active_r((Fl_Widget *)this);
  if (iVar4 == 0) {
    FVar6 = textcolor(this);
    local_124 = fl_inactive(FVar6);
  }
  else {
    local_124 = textcolor(this);
  }
  fl_color(local_124);
  (*(this->super_Fl_Valuator).super_Fl_Widget._vptr_Fl_Widget[0xb])(this,local_f8);
  iVar4 = Fl_Widget::y((Fl_Widget *)this);
  iVar5 = Fl_Widget::h((Fl_Widget *)this);
  fl_draw(local_f8,local_48,iVar4,W_1,iVar5,0,(Fl_Image *)0x0,1);
  pFVar7 = (Fl_Counter *)Fl::focus();
  FVar3 = local_28;
  if (pFVar7 == this) {
    iVar4 = Fl_Widget::y((Fl_Widget *)this);
    iVar5 = Fl_Widget::h((Fl_Widget *)this);
    Fl_Widget::draw_focus((Fl_Widget *)this,FVar3,local_48,iVar4,W_1,iVar5);
  }
  bVar2 = Fl_Widget::damage((Fl_Widget *)this);
  if ((bVar2 & 0x80) != 0) {
    iVar4 = Fl_Widget::active_r((Fl_Widget *)this);
    if (iVar4 == 0) {
      FVar6 = Fl_Widget::labelcolor((Fl_Widget *)this);
      local_2c = fl_inactive(FVar6);
    }
    else {
      local_2c = Fl_Widget::labelcolor((Fl_Widget *)this);
    }
    uVar1 = Fl_Widget::type((Fl_Widget *)this);
    if (uVar1 == '\0') {
      iVar4 = Fl_Widget::y((Fl_Widget *)this);
      iVar5 = Fl_Widget::h((Fl_Widget *)this);
      FVar6 = Fl_Widget::color((Fl_Widget *)this);
      Fl_Widget::draw_box((Fl_Widget *)this,selcolor,local_44,iVar4,ww[2],iVar5,FVar6);
      iVar4 = Fl_Widget::y((Fl_Widget *)this);
      iVar5 = Fl_Widget::h((Fl_Widget *)this);
      fl_draw_symbol("@-4<<",local_44,iVar4,ww[2],iVar5,local_2c);
    }
    iVar4 = Fl_Widget::y((Fl_Widget *)this);
    iVar5 = Fl_Widget::h((Fl_Widget *)this);
    FVar6 = Fl_Widget::color((Fl_Widget *)this);
    Fl_Widget::draw_box((Fl_Widget *)this,boxtype[0],xx[0],iVar4,ww[1],iVar5,FVar6);
    iVar4 = Fl_Widget::y((Fl_Widget *)this);
    iVar5 = Fl_Widget::h((Fl_Widget *)this);
    fl_draw_symbol("@-4<",xx[0],iVar4,ww[1],iVar5,local_2c);
    iVar4 = Fl_Widget::y((Fl_Widget *)this);
    iVar5 = Fl_Widget::h((Fl_Widget *)this);
    FVar6 = Fl_Widget::color((Fl_Widget *)this);
    Fl_Widget::draw_box((Fl_Widget *)this,boxtype[1],xx[1],iVar4,ww[1],iVar5,FVar6);
    iVar4 = Fl_Widget::y((Fl_Widget *)this);
    iVar5 = Fl_Widget::h((Fl_Widget *)this);
    fl_draw_symbol("@-4>",xx[1],iVar4,ww[1],iVar5,local_2c);
    uVar1 = Fl_Widget::type((Fl_Widget *)this);
    if (uVar1 == '\0') {
      iVar4 = Fl_Widget::y((Fl_Widget *)this);
      iVar5 = Fl_Widget::h((Fl_Widget *)this);
      FVar6 = Fl_Widget::color((Fl_Widget *)this);
      Fl_Widget::draw_box((Fl_Widget *)this,boxtype[2],xx[2],iVar4,ww[2],iVar5,FVar6);
      iVar4 = Fl_Widget::y((Fl_Widget *)this);
      iVar5 = Fl_Widget::h((Fl_Widget *)this);
      fl_draw_symbol("@-4>>",xx[2],iVar4,ww[2],iVar5,local_2c);
    }
  }
  return;
}

Assistant:

void Fl_Counter::draw() {
  int i; Fl_Boxtype boxtype[5];
  Fl_Color selcolor;

  boxtype[0] = box();
  if (boxtype[0] == FL_UP_BOX) boxtype[0] = FL_DOWN_BOX;
  if (boxtype[0] == FL_THIN_UP_BOX) boxtype[0] = FL_THIN_DOWN_BOX;
  for (i=1; i<5; i++)
    if (mouseobj == i)
      boxtype[i] = fl_down(box());
    else
      boxtype[i] = box();

  int xx[5], ww[5];
  if (type() == FL_NORMAL_COUNTER) {
    int W = w()*15/100;
    xx[1] = x();	 ww[1] = W;
    xx[2] = x()+1*W;     ww[2] = W;
    xx[0] = x()+2*W;     ww[0] = w()-4*W;
    xx[3] = x()+w()-2*W; ww[3] = W;
    xx[4] = x()+w()-1*W; ww[4] = W;
  } else {
    int W = w()*20/100;
    xx[1] = 0;	         ww[1] = 0;
    xx[2] = x();	 ww[2] = W;
    xx[0] = x()+W;	 ww[0] = w()-2*W;
    xx[3] = x()+w()-1*W; ww[3] = W;
    xx[4] = 0;	         ww[4] = 0;
  }

  draw_box(boxtype[0], xx[0], y(), ww[0], h(), FL_BACKGROUND2_COLOR);
  fl_font(textfont(), textsize());
  fl_color(active_r() ? textcolor() : fl_inactive(textcolor()));
  char str[128]; format(str);
  fl_draw(str, xx[0], y(), ww[0], h(), FL_ALIGN_CENTER);
  if (Fl::focus() == this) draw_focus(boxtype[0], xx[0], y(), ww[0], h());
  if (!(damage()&FL_DAMAGE_ALL)) return; // only need to redraw text

  if (active_r())
    selcolor = labelcolor();
  else
    selcolor = fl_inactive(labelcolor());

  if (type() == FL_NORMAL_COUNTER) {
    draw_box(boxtype[1], xx[1], y(), ww[1], h(), color());
    fl_draw_symbol("@-4<<", xx[1], y(), ww[1], h(), selcolor);
  }
  draw_box(boxtype[2], xx[2], y(), ww[2], h(), color());
  fl_draw_symbol("@-4<",  xx[2], y(), ww[2], h(), selcolor);
  draw_box(boxtype[3], xx[3], y(), ww[3], h(), color());
  fl_draw_symbol("@-4>",  xx[3], y(), ww[3], h(), selcolor);
  if (type() == FL_NORMAL_COUNTER) {
    draw_box(boxtype[4], xx[4], y(), ww[4], h(), color());
    fl_draw_symbol("@-4>>", xx[4], y(), ww[4], h(), selcolor);
  }
}